

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libquat_quat.cpp
# Opt level: O1

quaternion get_conjugate(quaternion *in_quat1)

{
  quaternion qVar1;
  
  if (in_quat1 != (quaternion *)0x0) {
    qVar1._0_8_ = *(ulong *)in_quat1 ^ 0x8000000000000000;
    qVar1.field_1._4_8_ = *(ulong *)((long)&in_quat1->field_1 + 4) ^ 0x8000000080000000;
    return qVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"get_conjugate",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,": Invalid input.\n",0x11);
  return (quaternion)ZEXT816(0);
}

Assistant:

quaternion get_conjugate(const quaternion *in_quat1) {
    if (!in_quat1) {
        std::cerr << __func__ << ": Invalid input.\n";
        return {0.f};
    }

    return !(*in_quat1);
}